

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::ThreadLocal<xatlas::internal::UniformGrid2>::ThreadLocal
          (ThreadLocal<xatlas::internal::UniformGrid2> *this)

{
  uint uVar1;
  UniformGrid2 *pUVar2;
  uint local_18;
  uint32_t i;
  uint32_t n;
  ThreadLocal<xatlas::internal::UniformGrid2> *this_local;
  
  uVar1 = std::thread::hardware_concurrency();
  pUVar2 = (UniformGrid2 *)
           Realloc((void *)0x0,(ulong)uVar1 * 0xa0,0,
                   "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                   ,0xf86);
  this->m_array = pUVar2;
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    UniformGrid2::UniformGrid2(this->m_array + local_18);
  }
  return;
}

Assistant:

ThreadLocal()
	{
#if XA_MULTITHREADED
		const uint32_t n = std::thread::hardware_concurrency();
#else
		const uint32_t n = 1;
#endif
		m_array = XA_ALLOC_ARRAY(MemTag::Default, T, n);
		for (uint32_t i = 0; i < n; i++)
			new (&m_array[i]) T;
	}